

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_linkpool_test.c
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int_linklist *link;
  int_linklist *link_00;
  int_linklist *link_01;
  testfunc_linklist *ptVar7;
  long *in_FS_OFFSET;
  
  int_linkpool_init();
  lVar2 = *in_FS_OFFSET;
  lVar1 = lVar2 + -0x28;
  lVar3 = in_FS_OFFSET[-5];
  int_linkpool_thrd_init();
  lVar4 = in_FS_OFFSET[-5];
  link = int_linkpool_rent();
  link_00 = int_linkpool_rent();
  link_01 = int_linkpool_rent();
  lVar5 = in_FS_OFFSET[-5];
  link->item = 0x3039;
  testfunc_linkpool_init();
  testfunc_linkpool_thrd_init();
  ptVar7 = testfunc_linkpool_rent();
  testfunc_linkpool_rent();
  uo__linklist_link((uo_linklist *)(lVar2 + -0x10),&ptVar7->link);
  ptVar7 = testfunc_linkpool_rent();
  ptVar7->item = testfunc_increment;
  iVar6 = link->item + 1;
  link->item = iVar6;
  int_linkpool_return(link);
  int_linkpool_return(link_00);
  int_linkpool_return(link_01);
  lVar2 = in_FS_OFFSET[-5];
  int_linkpool_thrd_quit();
  testfunc_linkpool_thrd_quit();
  return (int)((lVar2 == lVar1 || (iVar6 != 0x303a || lVar5 == lVar1)) ||
              (lVar4 != lVar1 || lVar3 != 0));
}

Assistant:

int main(
    int argc, 
    char const **argv)
{
    bool passed = true;

    passed &= int_linkpool_init();
    passed &= !int_linkpool_is_thrd_init();
    passed &= int_linkpool_thrd_init();
    passed &= int_linkpool_is_thrd_init();
    passed &= int_linkpool_is_empty();

    int_linklist *i0 = int_linkpool_rent();
    int_linklist *i1 = int_linkpool_rent();
    int_linklist *i2 = int_linkpool_rent();

    passed &= !int_linkpool_is_empty();

    i0->item = 12345;
    passed &= i0->item == 12345;

    passed &= testfunc_linkpool_init();
    passed &= testfunc_linkpool_thrd_init();

    testfunc_linklist *f0 = testfunc_linkpool_rent();
    testfunc_linklist *f1 = testfunc_linkpool_rent();
    testfunc_linkpool_return(f0);
    f0 = testfunc_linkpool_rent();

    f0->item = testfunc_increment;

    f0->item(&i0->item);

    passed &= i0->item == 12346;

    int_linkpool_return(i0);
    int_linkpool_return(i1);
    int_linkpool_return(i2);

    passed &= !int_linkpool_is_empty();

    int_linkpool_thrd_quit();
    testfunc_linkpool_thrd_quit();

    return passed ? 0 : 1;
}